

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O1

void __thiscall Psbt_SetTxInOnly_Test::TestBody(Psbt_SetTxInOnly_Test *this)

{
  bool bVar1;
  _func_int *message;
  char *pcVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  TxInReference txin_r;
  TxIn txin_l;
  Psbt psbt;
  TxIn txin_w;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_290;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_280 [16];
  AssertHelper local_270;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_268 [2];
  AssertHelper local_258;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  undefined1 local_248 [144];
  AbstractTxIn local_1b8;
  Psbt local_128;
  AbstractTxIn local_a8;
  
  cfd::Psbt::Psbt(&local_128);
  local_1b8._vptr_AbstractTxIn = (_func_int **)((ulong)local_1b8._vptr_AbstractTxIn._4_4_ << 0x20);
  local_248._0_4_ = cfd::core::Psbt::GetTxInCount();
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_a8,"0","psbt.GetTxInCount()",(int *)&local_1b8,(uint *)local_248);
  if ((char)local_a8._vptr_AbstractTxIn == '\0') {
    testing::Message::Message((Message *)&local_1b8);
    if (local_a8.txid_._vptr_Txid == (_func_int **)0x0) {
      message = (_func_int *)0x299ae3;
    }
    else {
      message = *local_a8.txid_._vptr_Txid;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x32c,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_248,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_248);
    if (local_1b8._vptr_AbstractTxIn != (_func_int **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_1b8._vptr_AbstractTxIn != (_func_int **)0x0)) {
        (**(code **)(*local_1b8._vptr_AbstractTxIn + 8))();
      }
      local_1b8._vptr_AbstractTxIn = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a8.txid_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_248._0_8_ = (AssertHelperData *)(local_248 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,"c078957064d70a5e80c3c23302528524d424aaabce86fb3fc1b6e6ea76fd7f26",
             "");
  cfd::core::Txid::Txid((Txid *)&local_1b8,(string *)local_248);
  cfd::core::TxIn::TxIn((TxIn *)&local_a8,(Txid *)&local_1b8,1,0xffffffff);
  local_1b8._vptr_AbstractTxIn = (_func_int **)&PTR__Txid_002e1e60;
  if (local_1b8.txid_._vptr_Txid != (_func_int **)0x0) {
    operator_delete(local_1b8.txid_._vptr_Txid);
  }
  if ((AssertHelperData *)local_248._0_8_ != (AssertHelperData *)(local_248 + 0x10)) {
    operator_delete((void *)local_248._0_8_);
  }
  local_290.ptr_ = local_280;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_290,"c0ecc9313d16355d71b96acff5bca43cdb593289e50154bab12cff422a46257d"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_248,(string *)&local_290);
  cfd::core::TxIn::TxIn((TxIn *)&local_1b8,(Txid *)local_248,0,0xffffffff);
  local_248._0_8_ = &PTR__Txid_002e1e60;
  if ((_func_int **)local_248._8_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_248._8_8_);
  }
  if (local_290.ptr_ != local_280) {
    operator_delete(local_290.ptr_);
  }
  cfd::core::TxInReference::TxInReference((TxInReference *)local_248,(TxIn *)&local_1b8);
  cfd::core::Psbt::AddTxIn((TxIn *)&local_128);
  cfd::core::Psbt::AddTxIn((TxInReference *)&local_128);
  local_270.data_._0_4_ = 2;
  local_258.data_._0_4_ = cfd::core::Psbt::GetTxInCount();
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_290,"2","psbt.GetTxInCount()",(int *)&local_270,(uint *)&local_258);
  if (local_290.ptr_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_270);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x332,pcVar2);
    testing::internal::AssertHelper::operator=(&local_258,(Message *)&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    if (local_270.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_270.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_270.data_ + 8))();
      }
      local_270.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_258,
             "\"70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000000"
             ,(char *)local_290.ptr_);
  if (local_290.ptr_ != local_280) {
    operator_delete(local_290.ptr_);
  }
  if (local_270.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_270.data_);
  }
  if (local_258.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_290);
    if (local_250.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_250.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x334,pcVar2);
    testing::internal::AssertHelper::operator=(&local_270,(Message *)&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    if (local_290.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_290.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_290.ptr_ + 8))();
      }
      local_290.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_250,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetBase64_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_270,
             "\"cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA==\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA=="
             ,(char *)local_290.ptr_);
  if (local_290.ptr_ != local_280) {
    operator_delete(local_290.ptr_);
  }
  if (local_270.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_290);
    if (local_268[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_268[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x335,pcVar2);
    testing::internal::AssertHelper::operator=(&local_258,(Message *)&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    if (local_290.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_290.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_290.ptr_ + 8))();
      }
      local_290.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_268,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)local_248);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_1b8);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_a8);
  local_128._0_8_ = &PTR__Psbt_002e61a0;
  std::
  _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  ::~_Rb_tree((_Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
               *)((long)&local_128 + 0x50));
  cfd::core::Psbt::~Psbt(&local_128.super_Psbt);
  return;
}

Assistant:

TEST(Psbt, SetTxInOnly) {
  Psbt psbt;
  EXPECT_EQ(0, psbt.GetTxInCount());
  TxIn txin_w(Txid("c078957064d70a5e80c3c23302528524d424aaabce86fb3fc1b6e6ea76fd7f26"), 1, 0xffffffff);
  TxIn txin_l(Txid("c0ecc9313d16355d71b96acff5bca43cdb593289e50154bab12cff422a46257d"), 0, 0xffffffff);
  TxInReference txin_r(txin_l);
  psbt.AddTxIn(txin_w);
  psbt.AddTxIn(txin_r);
  EXPECT_EQ(2, psbt.GetTxInCount());

  EXPECT_STREQ("70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000000", psbt.GetData().GetHex().c_str());
  EXPECT_STREQ("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA==", psbt.GetBase64().c_str());
}